

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int lyp_check_circmod(lys_module *module,char *value,int type)

{
  int iVar1;
  int in_ECX;
  undefined4 in_register_00000014;
  ulong uVar2;
  
  iVar1 = 0;
  if (value == (char *)CONCAT44(in_register_00000014,type)) {
LAB_00128238:
    ly_vlog((ly_ctx *)module,(uint)(in_ECX == 0) + LYE_CIRC_IMPORTS,LY_VLOG_NONE,(void *)0x0);
    iVar1 = -1;
  }
  else if ((ulong)*(byte *)&module->rev != 0) {
    uVar2 = 0;
    do {
      if (*(char **)(*(long *)(*(long *)&module->ident_size + uVar2 * 8) + 8) ==
          (char *)CONCAT44(in_register_00000014,type)) goto LAB_00128238;
      uVar2 = uVar2 + 1;
    } while (*(byte *)&module->rev != uVar2);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
lyp_check_circmod(struct lys_module *module, const char *value, int type)
{
    LY_ECODE code = type ? LYE_CIRC_IMPORTS : LYE_CIRC_INCLUDES;
    struct ly_modules_list *models = &module->ctx->models;
    uint8_t i;

    /* include/import itself */
    if (ly_strequal(module->name, value, 1)) {
        LOGVAL(module->ctx, code, LY_VLOG_NONE, NULL, value);
        return -1;
    }

    /* currently parsed modules */
    for (i = 0; i < models->parsing_sub_modules_count; i++) {
        if (ly_strequal(models->parsing_sub_modules[i]->name, value, 1)) {
            LOGVAL(module->ctx, code, LY_VLOG_NONE, NULL, value);
            return -1;
        }
    }

    return 0;
}